

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O1

void observe_quantum_cat(obj *box)

{
  boolean bVar1;
  uint uVar2;
  int iVar3;
  monst *mtmp;
  obj *poVar4;
  char *pcVar5;
  char *line;
  xchar oy;
  xchar ox;
  xchar local_1a;
  xchar local_19;
  
  box->spe = '\0';
  bVar1 = get_obj_location(box,&local_19,&local_1a,0);
  if (bVar1 != '\0') {
    box->ox = local_19;
    box->oy = local_1a;
  }
  uVar2 = mt_random();
  if ((uVar2 & 1) == 0) {
    mtmp = (monst *)0x0;
  }
  else {
    mtmp = makemon(mons + 0x23,level,(int)box->ox,(int)box->oy,1);
  }
  if (mtmp == (monst *)0x0) {
    poVar4 = mk_named_object(0x10e,mons + 0x23,(int)box->ox,(int)box->oy,"Schroedinger\'s Cat");
    if (poVar4 != (obj *)0x0) {
      obj_extract_self(poVar4);
      add_to_container(box,poVar4);
    }
    pcVar5 = "housecat";
    if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
       ((u.umonnum == u.umonster || (bVar1 = dmgtype(youmonst.data,0x24), bVar1 == '\0')))) {
      pcVar5 = rndmonnam();
    }
    pline("The %s inside the box is dead!",pcVar5);
    goto LAB_002139f7;
  }
  mtmp->field_0x62 = mtmp->field_0x62 | 0x40;
  set_malign(mtmp);
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) &&
       (((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
        (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || ((mtmp->data->mflags3 & 0x200) == 0))))))
    goto LAB_00213869;
LAB_00213813:
    uVar2 = *(uint *)&mtmp->field_0x60;
    if (((uVar2 & 2) != 0) && ((u.uprops[0xc].intrinsic == 0 && (u.uprops[0xc].extrinsic == 0)))) {
      if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_0021385c;
      goto LAB_00213869;
    }
    if ((uVar2 & 0x280) != 0) goto LAB_00213869;
LAB_0021385c:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_00213869;
LAB_002139cf:
    pcVar5 = Monnam(mtmp);
    line = "%s inside the box is still alive!";
  }
  else {
    bVar1 = worm_known(level,mtmp);
    if (bVar1 != '\0') goto LAB_00213813;
LAB_00213869:
    if (((((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar4 = which_armor(mtmp,4), poVar4 == (obj *)0x0 ||
          (poVar4 = which_armor(mtmp,4), poVar4->otyp != 0x4f)))) &&
        ((((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
           ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) ||
         (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
          (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar3 < 0x41)))))) ||
       (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
        (bVar1 = match_warn_of_mon(mtmp), bVar1 != '\0')))) goto LAB_002139cf;
    pcVar5 = body_part(5);
    line = "You think something brushed your %s.";
  }
  pline(line,pcVar5);
  christen_monst(mtmp,"Schroedinger\'s Cat");
LAB_002139f7:
  uVar2 = weight(box);
  box->owt = uVar2;
  return;
}

Assistant:

static void observe_quantum_cat(struct obj *box)
{
    static const char sc[] = "Schroedinger's Cat";
    struct obj *deadcat;
    struct monst *livecat;
    xchar ox, oy;

    box->spe = 0;		/* box->owt will be updated below */
    if (get_obj_location(box, &ox, &oy, 0))
	box->ox = ox, box->oy = oy;	/* in case it's being carried */

    /* this isn't really right, since any form of observation
       (telepathic or monster/object/food detection) ought to
       force the determination of alive vs dead state; but basing
       it just on opening the box is much simpler to cope with */
    livecat = rn2(2) ? makemon(&mons[PM_HOUSECAT], level,
			       box->ox, box->oy, NO_MINVENT) : 0;
    if (livecat) {
	livecat->mpeaceful = 1;
	set_malign(livecat);
	if (!canspotmon(level, livecat))
	    pline("You think something brushed your %s.", body_part(FOOT));
	else
	    pline("%s inside the box is still alive!", Monnam(livecat));
	christen_monst(livecat, sc);
    } else {
	deadcat = mk_named_object(CORPSE, &mons[PM_HOUSECAT],
				  box->ox, box->oy, sc);
	if (deadcat) {
	    obj_extract_self(deadcat);
	    add_to_container(box, deadcat);
	}
	pline("The %s inside the box is dead!",
	    Hallucination ? rndmonnam() : "housecat");
    }
    box->owt = weight(box);
    return;
}